

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O3

bool __thiscall
QNativeSocketEnginePrivate::nativeBind
          (QNativeSocketEnginePrivate *this,QHostAddress *address,quint16 port)

{
  bool bVar1;
  NetworkLayerProtocol NVar2;
  int iVar3;
  quint32 qVar4;
  int *piVar5;
  ErrorString errorString;
  SocketError error;
  long in_FS_OFFSET;
  int ipv6only;
  socklen_t sockAddrSize;
  undefined4 local_60;
  socklen_t local_5c;
  qt_sockaddr local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_4_ = 0xaaaaaaaa;
  local_58._20_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_4_ = 0xaaaaaaaa;
  local_58._12_4_ = 0xaaaaaaaa;
  local_5c = 0xaaaaaaaa;
  setPortAndAddress(this,port,address,&local_58,&local_5c);
  if (local_58.a.sa_family == 10) {
    local_60 = 0;
    NVar2 = QHostAddress::protocol(address);
    if (NVar2 == IPv6Protocol) {
      local_60 = 1;
    }
    setsockopt((int)this->socketDescriptor,0x29,0x1a,&local_60,4);
  }
  iVar3 = bind((int)this->socketDescriptor,(sockaddr *)&local_58.a,local_5c);
  if (iVar3 < 0) {
    piVar5 = __errno_location();
    iVar3 = *piVar5;
    if (iVar3 == 0x61) {
      NVar2 = QHostAddress::protocol(address);
      if (NVar2 == AnyIPProtocol) {
        local_58.a4.sin_port = port << 8 | port >> 8;
        local_58.a.sa_family = 2;
        qVar4 = QHostAddress::toIPv4Address(address,(bool *)0x0);
        local_58.a6.sin6_flowinfo =
             qVar4 >> 0x18 | (qVar4 & 0xff0000) >> 8 | (qVar4 & 0xff00) << 8 | qVar4 << 0x18;
        local_5c = 0x10;
        iVar3 = bind((int)this->socketDescriptor,(sockaddr *)&local_58.a,0x10);
        if (-1 < iVar3) goto LAB_0022f3c6;
      }
      iVar3 = *piVar5;
    }
    bVar1 = false;
    if (iVar3 < 0x62) {
      if (iVar3 == 0xd) {
        error = SocketAccessError;
        errorString = AddressProtectedErrorString;
      }
      else {
        bVar1 = false;
        if (iVar3 != 0x16) goto LAB_0022f498;
        error = UnsupportedSocketOperationError;
        errorString = OperationUnsupportedErrorString;
      }
    }
    else if (iVar3 == 99) {
      error = SocketAddressNotAvailableError;
      errorString = AddressNotAvailableErrorString;
    }
    else {
      if (iVar3 != 0x62) goto LAB_0022f498;
      error = AddressInUseError;
      errorString = AddressInuseErrorString;
    }
    setError(this,error,errorString);
    bVar1 = false;
  }
  else {
LAB_0022f3c6:
    (this->super_QAbstractSocketEnginePrivate).socketState = BoundState;
    bVar1 = true;
  }
LAB_0022f498:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QNativeSocketEnginePrivate::nativeBind(const QHostAddress &address, quint16 port)
{
    qt_sockaddr aa;
    QT_SOCKLEN_T sockAddrSize;
    setPortAndAddress(port, address, &aa, &sockAddrSize);

#ifdef IPV6_V6ONLY
    if (aa.a.sa_family == AF_INET6) {
        int ipv6only = 0;
        if (address.protocol() == QAbstractSocket::IPv6Protocol)
            ipv6only = 1;
        //default value of this socket option varies depending on unix variant (or system configuration on BSD), so always set it explicitly
        ::setsockopt(socketDescriptor, IPPROTO_IPV6, IPV6_V6ONLY, (char*)&ipv6only, sizeof(ipv6only) );
    }
#endif

    int bindResult = QT_SOCKET_BIND(socketDescriptor, &aa.a, sockAddrSize);
    if (bindResult < 0 && errno == EAFNOSUPPORT && address.protocol() == QAbstractSocket::AnyIPProtocol) {
        // retry with v4
        aa.a4.sin_family = AF_INET;
        aa.a4.sin_port = htons(port);
        aa.a4.sin_addr.s_addr = htonl(address.toIPv4Address());
        sockAddrSize = sizeof(aa.a4);
        bindResult = QT_SOCKET_BIND(socketDescriptor, &aa.a, sockAddrSize);
    }

    if (bindResult < 0) {
#if defined (QNATIVESOCKETENGINE_DEBUG)
        int ecopy = errno;
#endif
        switch(errno) {
        case EADDRINUSE:
            setError(QAbstractSocket::AddressInUseError, AddressInuseErrorString);
            break;
        case EACCES:
            setError(QAbstractSocket::SocketAccessError, AddressProtectedErrorString);
            break;
        case EINVAL:
            setError(QAbstractSocket::UnsupportedSocketOperationError, OperationUnsupportedErrorString);
            break;
        case EADDRNOTAVAIL:
            setError(QAbstractSocket::SocketAddressNotAvailableError, AddressNotAvailableErrorString);
            break;
        default:
            break;
        }

#if defined (QNATIVESOCKETENGINE_DEBUG)
        qDebug("QNativeSocketEnginePrivate::nativeBind(%s, %i) == false (%s)",
               address.toString().toLatin1().constData(), port, strerror(ecopy));
#endif

        return false;
    }

#if defined (QNATIVESOCKETENGINE_DEBUG)
    qDebug("QNativeSocketEnginePrivate::nativeBind(%s, %i) == true",
           address.toString().toLatin1().constData(), port);
#endif
    socketState = QAbstractSocket::BoundState;
    return true;
}